

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti_tool.c
# Opt level: O3

int act_add_exts(nt_opts *opts)

{
  int iVar1;
  uint len;
  nifti_image *nim;
  size_t sVar2;
  FILE *__stream;
  char *__ptr;
  long lVar3;
  long lVar4;
  char *pathname;
  char *__s;
  
  if (2 < g_debug) {
    act_add_exts_cold_1();
  }
  if ((opts->prefix == (char *)0x0) || ((opts->infiles).len == 1)) {
    iVar1 = 0;
    if (0 < (opts->elist).len) {
      if (0 < (opts->infiles).len) {
        lVar4 = 0;
        do {
          nim = nt_image_read(opts,(opts->infiles).list[lVar4],1);
          if (nim == (nifti_image *)0x0) goto LAB_00109e40;
          if (0 < (opts->elist).len) {
            lVar3 = 0;
            do {
              __s = (opts->elist).list[lVar3];
              sVar2 = strlen(__s);
              len = (uint)sVar2;
              iVar1 = strncmp(__s,"file:",5);
              if (iVar1 == 0) {
                pathname = __s + 5;
                len = nifti_get_filesize(pathname);
                if ((int)len < 1) {
                  fprintf(_stderr,"** RFT: file \'%s\' appears empty\n",pathname);
                }
                else {
                  __stream = fopen(pathname,"r");
                  if (__stream == (FILE *)0x0) {
                    fprintf(_stderr,"** RFT: failed to open \'%s\' for reading\n",pathname);
                  }
                  else {
                    __ptr = (char *)malloc((ulong)len);
                    if (__ptr == (char *)0x0) {
                      fprintf(_stderr,"** RFT: failed to allocate %d bytes\n",(ulong)len);
                      fclose(__stream);
                    }
                    else {
                      sVar2 = fread(__ptr,1,(ulong)len,__stream);
                      fclose(__stream);
                      if (len == (uint)sVar2) {
                        __s = __ptr;
                        if ((1 < g_debug) &&
                           (fprintf(_stderr,"++ found extension of length %d in file %s\n",
                                    (ulong)len,pathname), 2 < g_debug)) {
                          fprintf(_stderr,"++ text is:\n%s\n",__ptr);
                        }
                        goto LAB_00109c29;
                      }
                      fprintf(_stderr,"** RFT: read only %d of %d bytes from %s\n",
                              sVar2 & 0xffffffff,(ulong)len,pathname);
                      free(__ptr);
                    }
                  }
                }
                fprintf(_stderr,"** failed to read extension data from \'%s\'\n",pathname);
              }
              else {
                __ptr = (char *)0x0;
LAB_00109c29:
                iVar1 = nifti_add_extension(nim,__s,len,(opts->etypes).list[lVar3]);
                if (iVar1 != 0) goto LAB_00109e36;
                if (__ptr != (char *)0x0) {
                  free(__ptr);
                }
              }
              lVar3 = lVar3 + 1;
            } while (lVar3 < (opts->elist).len);
          }
          if (opts->keep_hist != 0) {
            sVar2 = strlen(opts->command);
            iVar1 = nifti_add_extension(nim,opts->command,(int)sVar2,6);
            if (iVar1 != 0) {
              act_add_exts_cold_2();
            }
          }
          if ((opts->prefix != (char *)0x0) &&
             (iVar1 = nifti_set_filenames(nim,opts->prefix,(uint)(opts->overwrite == 0),1),
             iVar1 != 0)) {
LAB_00109e36:
            nifti_image_free(nim);
            goto LAB_00109e40;
          }
          if (1 < g_debug) {
            fprintf(_stderr,"+d writing %s with %d new extension(s)\n",(opts->infiles).list[lVar4],
                    (ulong)(uint)(opts->elist).len);
          }
          nifti_image_write(nim);
          nifti_image_free(nim);
          lVar4 = lVar4 + 1;
        } while (lVar4 < (opts->infiles).len);
      }
      iVar1 = 0;
      if (0 < g_debug) {
        fprintf(_stderr,"+d added %d extension(s) to %d files\n",(ulong)(uint)(opts->elist).len);
        iVar1 = 0;
      }
    }
  }
  else {
    fprintf(_stderr,"** error: we have a prefix but %d files\n");
LAB_00109e40:
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

int act_add_exts( nt_opts * opts )
{
   nifti_image      * nim;
   char             * ext, * edata = NULL;
   int                fc, ec, elen;

   if( g_debug > 2 ){
      fprintf(stderr,"+d adding %d extensions to %d files...\n"
                     "   extension types are: ",
              opts->elist.len, opts->infiles.len);
      disp_raw_data(opts->etypes.list, DT_INT32, opts->etypes.len, ' ', 1);
   }

   if( opts->prefix && opts->infiles.len != 1 ){
      fprintf(stderr,"** error: we have a prefix but %d files\n",
              opts->infiles.len);
      return 1;
   }

   if( opts->elist.len <= 0 ) return 0;

   for( fc = 0; fc < opts->infiles.len; fc++ )
   {
      nim = nt_image_read( opts, opts->infiles.list[fc], 1 );
      if( !nim ) return 1;  /* errors come from the library */

      for( ec = 0; ec < opts->elist.len; ec++ ){
         ext = opts->elist.list[ec];
         elen = strlen(ext);
         if( !strncmp(ext,"file:",5) ){
            edata = read_file_text(ext+5, &elen);
            if( !edata || elen <= 0 ) {
               fprintf(stderr,"** failed to read extension data from '%s'\n",
                       ext+5);
               continue;
            }
            ext = edata;
         }

         if( nifti_add_extension(nim, ext, elen, opts->etypes.list[ec]) ){
            nifti_image_free(nim);
            return 1;
         }

         /* if extension came from file, free the data */
         if( edata ){ free(edata); edata = NULL; }
      }

      if( opts->keep_hist && nifti_add_extension(nim, opts->command,
                             strlen(opts->command), NIFTI_ECODE_COMMENT) )
         fprintf(stderr,"** failed to add command to image as extension\n");

      if( opts->prefix &&
          nifti_set_filenames(nim, opts->prefix, !opts->overwrite, 1) )
      {
         nifti_image_free(nim);
         return 1;
      }

      if( g_debug > 1 )
         fprintf(stderr,"+d writing %s with %d new extension(s)\n",
                 opts->infiles.list[fc], opts->elist.len);

      nifti_image_write(nim);
      nifti_image_free(nim);
   }

   if( g_debug > 0 )
      fprintf(stderr,"+d added %d extension(s) to %d files\n",
              opts->elist.len, opts->infiles.len);

   return 0;
}